

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::objectivec::TextFormatDecodeData::Data_abi_cxx11_
          (string *__return_storage_ptr__,TextFormatDecodeData *this)

{
  pointer ppVar1;
  pointer data;
  bool bVar2;
  uint uVar3;
  byte *ptr;
  uint uVar4;
  ulong uVar5;
  int size;
  ulong uVar6;
  pointer ppVar7;
  byte *ptr_00;
  size_t __n;
  CodedOutputStream output_stream;
  OstreamOutputStream data_outputstream;
  ostringstream data_stringstream;
  CodedOutputStream local_240;
  OstreamOutputStream local_1f0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  if ((this->entries_).
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->entries_).
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    io::OstreamOutputStream::OstreamOutputStream(&local_1f0,(ostream *)local_1a8,-1);
    io::CodedOutputStream::CodedOutputStream(&local_240,&local_1f0.super_ZeroCopyOutputStream,true);
    ppVar7 = (this->entries_).
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar1 = (this->entries_).
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_240.impl_.end_ <= local_240.cur_) {
      local_240.cur_ = io::EpsCopyOutputStream::EnsureSpaceFallback(&local_240.impl_,local_240.cur_)
      ;
    }
    uVar6 = ((long)ppVar7 - (long)ppVar1 >> 3) * -0x3333333333333333;
    *local_240.cur_ = (byte)uVar6;
    if ((uint)uVar6 < 0x80) {
      ptr_00 = local_240.cur_ + 1;
    }
    else {
      *local_240.cur_ = (byte)uVar6 | 0x80;
      uVar5 = uVar6 >> 7 & 0x1ffffff;
      local_240.cur_[1] = (byte)uVar5;
      ptr_00 = local_240.cur_ + 2;
      if (0x3fff < (uint)uVar6) {
        uVar6 = (ulong)local_240.cur_[1];
        do {
          ptr_00[-1] = (byte)uVar6 | 0x80;
          uVar6 = uVar5 >> 7;
          *ptr_00 = (byte)uVar6;
          ptr_00 = ptr_00 + 1;
          uVar4 = (uint)uVar5;
          uVar5 = uVar6;
        } while (0x3fff < uVar4);
      }
    }
    ppVar7 = (this->entries_).
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_240.cur_ = ptr_00;
    if (ppVar7 != (this->entries_).
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        uVar4 = ppVar7->first;
        if (local_240.impl_.end_ <= ptr_00) {
          local_240.cur_ = ptr_00;
          ptr_00 = io::EpsCopyOutputStream::EnsureSpaceFallback(&local_240.impl_,ptr_00);
        }
        *ptr_00 = (byte)uVar4;
        if (uVar4 < 0x80) {
          ptr = ptr_00 + 1;
        }
        else {
          *ptr_00 = (byte)uVar4 | 0x80;
          ptr_00[1] = (byte)(uVar4 >> 7);
          ptr = ptr_00 + 2;
          if (0x3fff < uVar4) {
            uVar3 = (uint)ptr_00[1];
            uVar4 = uVar4 >> 7;
            do {
              ptr[-1] = (byte)uVar3 | 0x80;
              uVar3 = uVar4 >> 7;
              *ptr = (byte)uVar3;
              ptr = ptr + 1;
              bVar2 = 0x3fff < uVar4;
              uVar4 = uVar3;
            } while (bVar2);
          }
        }
        data = (ppVar7->second)._M_dataplus._M_p;
        size = (int)(ppVar7->second)._M_string_length;
        __n = (size_t)size;
        local_240.cur_ = ptr;
        if ((long)local_240.impl_.end_ - (long)ptr < (long)__n) {
          ptr_00 = io::EpsCopyOutputStream::WriteRawFallback(&local_240.impl_,data,size,ptr);
        }
        else {
          memcpy(ptr,data,__n);
          ptr_00 = ptr + __n;
        }
        ppVar7 = ppVar7 + 1;
        local_240.cur_ = ptr_00;
      } while (ppVar7 != (this->entries_).
                         super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    io::CodedOutputStream::~CodedOutputStream(&local_240);
    io::OstreamOutputStream::~OstreamOutputStream(&local_1f0);
  }
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormatDecodeData::Data() const {
  std::ostringstream data_stringstream;

  if (num_entries() > 0) {
    io::OstreamOutputStream data_outputstream(&data_stringstream);
    io::CodedOutputStream output_stream(&data_outputstream);

    output_stream.WriteVarint32(num_entries());
    for (std::vector<DataEntry>::const_iterator i = entries_.begin();
         i != entries_.end(); ++i) {
      output_stream.WriteVarint32(i->first);
      output_stream.WriteString(i->second);
    }
  }

  data_stringstream.flush();
  return data_stringstream.str();
}